

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::place(QMdiAreaPrivate *this,Placer *placer,QMdiSubWindow *child)

{
  QWidget *ancestor;
  QWidgetData *pQVar1;
  long lVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  long lVar4;
  bool bVar5;
  LayoutDirection LVar6;
  Representation extraout_var;
  QWidget *this_00;
  QArrayData *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  QRect local_88;
  QRect local_78;
  QRect local_68;
  QList<QRect> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (child != (QMdiSubWindow *)0x0 && placer != (Placer *)0x0) {
    ancestor = *(QWidget **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8;
    if ((ancestor->data->widget_attributes & 0x8000) == 0) {
      local_58.d.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)child);
      local_58.d.ptr = (QRect *)child;
      QtPrivate::QMovableArrayOps<QPointer<QMdiSubWindow>>::emplace<QPointer<QMdiSubWindow>>
                ((QMovableArrayOps<QPointer<QMdiSubWindow>> *)&this->pendingPlacements,
                 (this->pendingPlacements).d.size,(QPointer<QMdiSubWindow> *)&local_58);
      QList<QPointer<QMdiSubWindow>_>::end(&this->pendingPlacements);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          pQVar7 = &(local_58.d.d)->super_QArrayData;
          if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) {
            pQVar7 = (QArrayData *)0x0;
          }
          operator_delete(pQVar7);
        }
      }
    }
    else {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (QRect *)0x0;
      local_58.d.size = 0;
      QList<QRect>::reserve(&local_58,(this->childWindows).d.size);
      pQVar1 = ancestor->data;
      local_68.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      local_68.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
      local_68.x1.m_i = 0;
      local_68.y1.m_i = 0;
      lVar2 = (this->childWindows).d.size;
      if (lVar2 != 0) {
        pQVar3 = (this->childWindows).d.ptr;
        lVar8 = 0;
        do {
          lVar4 = *(long *)((long)&(pQVar3->wp).d + lVar8);
          if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
            this_00 = (QWidget *)0x0;
          }
          else {
            this_00 = *(QWidget **)((long)&(pQVar3->wp).value + lVar8);
          }
          bVar5 = sanityCheck((QMdiSubWindow *)this_00,"QMdiArea::place");
          if ((this_00 != &child->super_QWidget) && (bVar5)) {
            bVar5 = QWidget::isVisibleTo(this_00,ancestor);
            if (bVar5) {
              bVar5 = QWidget::testAttribute_helper(this_00,WA_Moved);
              if (bVar5) {
                local_78.x1.m_i = 0;
                local_78.y1.m_i = 0;
                local_78.x2.m_i = -1;
                local_78.y2.m_i = -1;
                bVar5 = QWidget::isMaximized(this_00);
                if (bVar5) {
                  lVar4 = *(long *)&this_00->field_0x8;
                  local_78._0_8_ = *(undefined8 *)(lVar4 + 0x2a8);
                  local_78.y2.m_i = *(int *)(lVar4 + 0x2cc) + local_78.y1.m_i + -1;
                  local_78.x2.m_i = *(int *)(lVar4 + 0x2c8) + local_78.x1.m_i + -1;
                }
                else {
                  pQVar1 = this_00->data;
                  local_78.x1.m_i = (pQVar1->crect).x1.m_i;
                  local_78.y1.m_i = (pQVar1->crect).y1.m_i;
                  local_78.x2.m_i = (pQVar1->crect).x2.m_i;
                  local_78.y2.m_i = (pQVar1->crect).y2.m_i;
                }
                LVar6 = QWidget::layoutDirection(&child->super_QWidget);
                local_88 = QStyle::visualRect(LVar6,&local_68,&local_78);
                QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                          ((QMovableArrayOps<QRect> *)&local_58,local_58.d.size,&local_88);
                QList<QRect>::end(&local_58);
              }
            }
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar2 << 4 != lVar8);
      }
      pQVar1 = (child->super_QWidget).data;
      local_78.x1.m_i = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
      local_78.y1.m_i = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
      local_78.x1.m_i = (**placer->_vptr_Placer)(placer,&local_78,&local_58,&local_68);
      pQVar1 = (child->super_QWidget).data;
      local_78.y1.m_i = extraout_var.m_i;
      local_78.y2.m_i = ((pQVar1->crect).y2.m_i + extraout_var.m_i) - (pQVar1->crect).y1.m_i;
      local_78.x2.m_i = ((pQVar1->crect).x2.m_i + local_78.x1.m_i) - (pQVar1->crect).x1.m_i;
      LVar6 = QWidget::layoutDirection(&child->super_QWidget);
      local_88 = QStyle::visualRect(LVar6,&local_68,&local_78);
      QWidget::setGeometry(&child->super_QWidget,&local_88);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x10,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::place(Placer *placer, QMdiSubWindow *child)
{
    if (!placer || !child)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // The window is only laid out when it's added to QMdiArea,
        // so there's no need to check that we don't have it in the
        // list already. appendChild() ensures that.
        pendingPlacements.append(child);
        return;
    }

    QList<QRect> rects;
    rects.reserve(childWindows.size());
    QRect parentRect = q->rect();
    for (QMdiSubWindow *window : std::as_const(childWindows)) {
        if (!sanityCheck(window, "QMdiArea::place") || window == child || !window->isVisibleTo(q)
                || !window->testAttribute(Qt::WA_Moved)) {
            continue;
        }
        QRect occupiedGeometry;
        if (window->isMaximized()) {
            occupiedGeometry = QRect(window->d_func()->oldGeometry.topLeft(),
                                     window->d_func()->restoreSize);
        } else {
            occupiedGeometry = window->geometry();
        }
        rects.append(QStyle::visualRect(child->layoutDirection(), parentRect, occupiedGeometry));
    }
    QPoint newPos = placer->place(child->size(), rects, parentRect);
    QRect newGeometry = QRect(newPos.x(), newPos.y(), child->width(), child->height());
    child->setGeometry(QStyle::visualRect(child->layoutDirection(), parentRect, newGeometry));
}